

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  byte *pbVar1;
  uint *puVar2;
  uv__signal_tree_s uVar3;
  uv_signal_s *puVar4;
  uv_signal_t *puVar5;
  uv_signal_s *puVar6;
  int iVar7;
  uint uVar8;
  uv_signal_t *puVar9;
  long lVar10;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar11;
  uv_signal_t *puVar12;
  uv_signal_s *puVar13;
  uv__signal_tree_s *puVar14;
  uv_signal_s *puVar15;
  sigset_t saved_sigmask;
  sigset_t sStack_a8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                  ,0x168,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
  }
  if (signum == 0) {
    return -0x16;
  }
  if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }
  uv__signal_block_and_lock(&sStack_a8);
  puVar9 = uv__signal_first_handle(signum);
  if (puVar9 == (uv_signal_t *)0x0) {
    iVar7 = uv__signal_register_handler(signum,oneshot);
    if (iVar7 != 0) {
LAB_00680b22:
      uv__signal_unlock_and_unblock(&sStack_a8);
      return iVar7;
    }
    handle->signum = signum;
    if (oneshot == 0) goto LAB_00680b35;
  }
  else {
    if (oneshot == 0) {
      if (((puVar9->flags & 0x2000000) != 0) &&
         (iVar7 = uv__signal_register_handler(signum,0), iVar7 != 0)) goto LAB_00680b22;
      handle->signum = signum;
      goto LAB_00680b35;
    }
    handle->signum = signum;
  }
  pbVar1 = (byte *)((long)&handle->flags + 3);
  *pbVar1 = *pbVar1 | 2;
LAB_00680b35:
  uVar3.rbh_root = uv__signal_tree.rbh_root;
  if (uv__signal_tree.rbh_root == (uv_signal_s *)0x0) {
    (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_parent = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_color = 1;
    uv__signal_tree.rbh_root = handle;
  }
  else {
    do {
      puVar15 = uVar3.rbh_root;
      uVar8 = uv__signal_compare(handle,puVar15);
      if ((int)uVar8 < 0) {
        lVar10 = 0x70;
      }
      else {
        lVar10 = 0x78;
        if (uVar8 == 0) goto LAB_00680e01;
      }
      uVar3.rbh_root = *(uv_signal_s **)((long)puVar15->handle_queue + lVar10 + -0x20);
    } while (uVar3.rbh_root != (uv_signal_t *)0x0);
    (handle->tree_entry).rbe_parent = puVar15;
    (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_color = 1;
    puVar15->handle_queue[(ulong)(~uVar8 >> 0x1f) + 10] = handle;
    puVar9 = handle;
    do {
      if ((puVar15->tree_entry).rbe_color != 1) break;
      puVar4 = (puVar15->tree_entry).rbe_parent;
      puVar13 = (puVar4->tree_entry).rbe_left;
      if (puVar15 == puVar13) {
        puVar6 = (puVar4->tree_entry).rbe_right;
        if ((puVar6 != (uv_signal_s *)0x0) && ((puVar6->tree_entry).rbe_color == 1)) {
          (puVar6->tree_entry).rbe_color = 0;
          goto LAB_00680c01;
        }
        puVar5 = (puVar15->tree_entry).rbe_right;
        puVar12 = puVar15;
        if (puVar5 == puVar9) {
          puVar13 = (puVar5->tree_entry).rbe_left;
          (puVar15->tree_entry).rbe_right = puVar13;
          if (puVar13 == (uv_signal_s *)0x0) {
            (puVar5->tree_entry).rbe_parent = puVar4;
            puVar13 = (puVar15->tree_entry).rbe_parent;
LAB_00680d33:
            puVar14 = (uv__signal_tree_s *)&(puVar13->tree_entry).rbe_right;
            if (puVar15 == (puVar13->tree_entry).rbe_left) {
              puVar14 = (uv__signal_tree_s *)&puVar13->tree_entry;
            }
          }
          else {
            (puVar13->tree_entry).rbe_parent = puVar15;
            puVar13 = (puVar15->tree_entry).rbe_parent;
            (puVar5->tree_entry).rbe_parent = puVar13;
            puVar14 = &uv__signal_tree;
            if (puVar13 != (uv_signal_s *)0x0) goto LAB_00680d33;
          }
          ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar14)->rbe_left = puVar5;
          (puVar5->tree_entry).rbe_left = puVar15;
          (puVar15->tree_entry).rbe_parent = puVar5;
          puVar13 = (puVar4->tree_entry).rbe_left;
          puVar12 = puVar9;
          puVar9 = puVar15;
        }
        (puVar12->tree_entry).rbe_color = 0;
        (puVar4->tree_entry).rbe_color = 1;
        puVar15 = (puVar13->tree_entry).rbe_right;
        (puVar4->tree_entry).rbe_left = puVar15;
        if (puVar15 != (uv_signal_s *)0x0) {
          (puVar15->tree_entry).rbe_parent = puVar4;
        }
        puVar15 = (puVar4->tree_entry).rbe_parent;
        (puVar13->tree_entry).rbe_parent = puVar15;
        paVar11 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        if (puVar15 != (uv_signal_s *)0x0) {
          paVar11 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar15->tree_entry).rbe_right;
          if (puVar4 == (puVar15->tree_entry).rbe_left) {
            paVar11 = &puVar15->tree_entry;
          }
        }
        paVar11->rbe_left = puVar13;
        (puVar13->tree_entry).rbe_right = puVar4;
        (puVar4->tree_entry).rbe_parent = puVar13;
      }
      else if ((puVar13 == (uv_signal_s *)0x0) || ((puVar13->tree_entry).rbe_color != 1)) {
        puVar5 = (puVar15->tree_entry).rbe_left;
        puVar12 = puVar15;
        if (puVar5 == puVar9) {
          puVar13 = (puVar5->tree_entry).rbe_right;
          (puVar15->tree_entry).rbe_left = puVar13;
          if (puVar13 == (uv_signal_s *)0x0) {
            (puVar5->tree_entry).rbe_parent = puVar4;
            puVar13 = (puVar15->tree_entry).rbe_parent;
LAB_00680c9f:
            puVar14 = (uv__signal_tree_s *)&(puVar13->tree_entry).rbe_right;
            if (puVar15 == (puVar13->tree_entry).rbe_left) {
              puVar14 = (uv__signal_tree_s *)&puVar13->tree_entry;
            }
          }
          else {
            (puVar13->tree_entry).rbe_parent = puVar15;
            puVar13 = (puVar15->tree_entry).rbe_parent;
            (puVar5->tree_entry).rbe_parent = puVar13;
            puVar14 = &uv__signal_tree;
            if (puVar13 != (uv_signal_s *)0x0) goto LAB_00680c9f;
          }
          ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar14)->rbe_left = puVar5;
          (puVar5->tree_entry).rbe_right = puVar15;
          (puVar15->tree_entry).rbe_parent = puVar5;
          puVar12 = puVar9;
          puVar9 = puVar15;
        }
        (puVar12->tree_entry).rbe_color = 0;
        (puVar4->tree_entry).rbe_color = 1;
        puVar15 = (puVar4->tree_entry).rbe_right;
        puVar13 = (puVar15->tree_entry).rbe_left;
        (puVar4->tree_entry).rbe_right = puVar13;
        if (puVar13 != (uv_signal_s *)0x0) {
          (puVar13->tree_entry).rbe_parent = puVar4;
        }
        puVar13 = (puVar4->tree_entry).rbe_parent;
        (puVar15->tree_entry).rbe_parent = puVar13;
        paVar11 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        if (puVar13 != (uv_signal_s *)0x0) {
          paVar11 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar13->tree_entry).rbe_right;
          if (puVar4 == (puVar13->tree_entry).rbe_left) {
            paVar11 = &puVar13->tree_entry;
          }
        }
        paVar11->rbe_left = puVar15;
        (puVar15->tree_entry).rbe_left = puVar4;
        (puVar4->tree_entry).rbe_parent = puVar15;
      }
      else {
        (puVar13->tree_entry).rbe_color = 0;
LAB_00680c01:
        (puVar15->tree_entry).rbe_color = 0;
        (puVar4->tree_entry).rbe_color = 1;
        puVar9 = puVar4;
      }
      puVar15 = (puVar9->tree_entry).rbe_parent;
    } while (puVar15 != (uv_signal_s *)0x0);
  }
  ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_00680e01:
  uv__signal_unlock_and_unblock(&sStack_a8);
  handle->signal_cb = signal_cb;
  uVar8 = handle->flags;
  if (((uVar8 & 4) == 0) && (handle->flags = uVar8 | 4, (uVar8 & 8) != 0)) {
    puVar2 = &handle->loop->active_handles;
    *puVar2 = *puVar2 + 1;
  }
  return 0;
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}